

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O3

void redraw(Am_Drawonable *d)

{
  long lVar1;
  undefined8 uVar2;
  char *pcVar3;
  Am_Drawonable *pAVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  
  if (d1 == d) {
    lVar1 = *(long *)d1;
    pcVar3 = "Top-level window";
    puVar5 = &font1;
    uVar2 = 0x10;
    uVar6 = 0x57;
    pAVar4 = d1;
  }
  else {
    if (d2 == d) {
      lVar1 = *(long *)d2;
      pcVar3 = "Child of top-level";
      puVar5 = &font2;
      uVar2 = 0x12;
      pAVar4 = d2;
    }
    else {
      lVar1 = *(long *)d3;
      pcVar3 = "Child of child window";
      puVar5 = &font3;
      uVar2 = 0x15;
      pAVar4 = d3;
    }
    uVar6 = 7;
  }
  (**(code **)(lVar1 + 0x170))(pAVar4,&black,pcVar3,uVar2,puVar5,5,uVar6,0,&Am_No_Style,0);
  (**(code **)(*(long *)d1 + 0xa0))();
  return;
}

Assistant:

void
redraw(Am_Drawonable *d)
{
  static const char *string1 = "Top-level window";
  static int string1_len = 16;
  static const char *string2 = "Child of top-level";
  static int string2_len = 18;
  static const char *string3 = "Child of child window";
  static int string3_len = 21;

  if (d == d1)
    d1->Draw_Text(black, string1, string1_len, font1, 5, 87);
  else if (d == d2)
    d2->Draw_Text(black, string2, string2_len, font2, 5, 7);
  else
    d3->Draw_Text(black, string3, string3_len, font3, 5, 7);
  d1->Flush_Output();
}